

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb_sse2.c
# Opt level: O0

__m128i get_coeff_contexts_kernel_sse2(__m128i *level)

{
  longlong lVar1;
  longlong lVar2;
  longlong in_RDX;
  __m128i alVar3;
  char local_1b8;
  char cStack_1b7;
  char cStack_1b6;
  char cStack_1b5;
  char cStack_1b4;
  char cStack_1b3;
  char cStack_1b2;
  char cStack_1b1;
  char cStack_1b0;
  char cStack_1af;
  char cStack_1ae;
  char cStack_1ad;
  char cStack_1ac;
  char cStack_1ab;
  char cStack_1aa;
  char cStack_1a9;
  char local_198;
  char cStack_197;
  char cStack_196;
  char cStack_195;
  char cStack_194;
  char cStack_193;
  char cStack_192;
  char cStack_191;
  char cStack_190;
  char cStack_18f;
  char cStack_18e;
  char cStack_18d;
  char cStack_18c;
  char cStack_18b;
  char cStack_18a;
  char cStack_189;
  char local_178;
  char cStack_177;
  char cStack_176;
  char cStack_175;
  char cStack_174;
  char cStack_173;
  char cStack_172;
  char cStack_171;
  char cStack_170;
  char cStack_16f;
  char cStack_16e;
  char cStack_16d;
  char cStack_16c;
  char cStack_16b;
  char cStack_16a;
  char cStack_169;
  char local_158;
  char cStack_157;
  char cStack_156;
  char cStack_155;
  char cStack_154;
  char cStack_153;
  char cStack_152;
  char cStack_151;
  char cStack_150;
  char cStack_14f;
  char cStack_14e;
  char cStack_14d;
  char cStack_14c;
  char cStack_14b;
  char cStack_14a;
  char cStack_149;
  byte local_c8;
  byte bStack_c7;
  byte bStack_c6;
  byte bStack_c5;
  byte bStack_c4;
  byte bStack_c3;
  byte bStack_c2;
  byte bStack_c1;
  byte bStack_c0;
  byte bStack_bf;
  byte bStack_be;
  byte bStack_bd;
  byte bStack_bc;
  byte bStack_bb;
  byte bStack_ba;
  byte bStack_b9;
  byte local_a8;
  byte bStack_a7;
  byte bStack_a6;
  byte bStack_a5;
  byte bStack_a4;
  byte bStack_a3;
  byte bStack_a2;
  byte bStack_a1;
  byte bStack_a0;
  byte bStack_9f;
  byte bStack_9e;
  byte bStack_9d;
  byte bStack_9c;
  byte bStack_9b;
  byte bStack_9a;
  byte bStack_99;
  byte bStack_88;
  byte bStack_87;
  byte bStack_86;
  byte bStack_85;
  byte bStack_84;
  byte bStack_83;
  byte bStack_82;
  byte bStack_81;
  __m128i count;
  __m128i const_4;
  __m128i const_3;
  __m128i *level_local;
  byte local_48;
  byte bStack_47;
  byte bStack_46;
  byte bStack_45;
  byte bStack_44;
  byte bStack_43;
  byte bStack_42;
  byte bStack_41;
  byte bStack_40;
  byte bStack_3f;
  byte bStack_3e;
  byte bStack_3d;
  byte bStack_3c;
  byte bStack_3b;
  byte bStack_3a;
  byte bStack_39;
  
  lVar1 = (*level)[0];
  lVar2 = (*level)[1];
  local_48 = (byte)lVar1;
  bStack_47 = (byte)((ulong)lVar1 >> 8);
  bStack_46 = (byte)((ulong)lVar1 >> 0x10);
  bStack_45 = (byte)((ulong)lVar1 >> 0x18);
  bStack_44 = (byte)((ulong)lVar1 >> 0x20);
  bStack_43 = (byte)((ulong)lVar1 >> 0x28);
  bStack_42 = (byte)((ulong)lVar1 >> 0x30);
  bStack_41 = (byte)((ulong)lVar1 >> 0x38);
  bStack_40 = (byte)lVar2;
  bStack_3f = (byte)((ulong)lVar2 >> 8);
  bStack_3e = (byte)((ulong)lVar2 >> 0x10);
  bStack_3d = (byte)((ulong)lVar2 >> 0x18);
  bStack_3c = (byte)((ulong)lVar2 >> 0x20);
  bStack_3b = (byte)((ulong)lVar2 >> 0x28);
  bStack_3a = (byte)((ulong)lVar2 >> 0x30);
  bStack_39 = (byte)((ulong)lVar2 >> 0x38);
  lVar1 = level[1][0];
  lVar2 = level[1][1];
  const_4[1]._0_1_ = (byte)lVar1;
  const_4[1]._1_1_ = (byte)((ulong)lVar1 >> 8);
  const_4[1]._2_1_ = (byte)((ulong)lVar1 >> 0x10);
  const_4[1]._3_1_ = (byte)((ulong)lVar1 >> 0x18);
  const_4[1]._4_1_ = (byte)((ulong)lVar1 >> 0x20);
  const_4[1]._5_1_ = (byte)((ulong)lVar1 >> 0x28);
  const_4[1]._6_1_ = (byte)((ulong)lVar1 >> 0x30);
  const_4[1]._7_1_ = (byte)((ulong)lVar1 >> 0x38);
  const_3[0]._0_1_ = (byte)lVar2;
  const_3[0]._1_1_ = (byte)((ulong)lVar2 >> 8);
  const_3[0]._2_1_ = (byte)((ulong)lVar2 >> 0x10);
  const_3[0]._3_1_ = (byte)((ulong)lVar2 >> 0x18);
  const_3[0]._4_1_ = (byte)((ulong)lVar2 >> 0x20);
  const_3[0]._5_1_ = (byte)((ulong)lVar2 >> 0x28);
  const_3[0]._6_1_ = (byte)((ulong)lVar2 >> 0x30);
  const_3[0]._7_1_ = (byte)((ulong)lVar2 >> 0x38);
  *(byte *)level[1] = (3 < (byte)const_4[1]) * '\x03' | (3 >= (byte)const_4[1]) * (byte)const_4[1];
  *(byte *)((long)level[1] + 1) =
       (3 < const_4[1]._1_1_) * '\x03' | (3 >= const_4[1]._1_1_) * const_4[1]._1_1_;
  *(byte *)((long)level[1] + 2) =
       (3 < const_4[1]._2_1_) * '\x03' | (3 >= const_4[1]._2_1_) * const_4[1]._2_1_;
  *(byte *)((long)level[1] + 3) =
       (3 < const_4[1]._3_1_) * '\x03' | (3 >= const_4[1]._3_1_) * const_4[1]._3_1_;
  *(byte *)((long)level[1] + 4) =
       (3 < const_4[1]._4_1_) * '\x03' | (3 >= const_4[1]._4_1_) * const_4[1]._4_1_;
  *(byte *)((long)level[1] + 5) =
       (3 < const_4[1]._5_1_) * '\x03' | (3 >= const_4[1]._5_1_) * const_4[1]._5_1_;
  *(byte *)((long)level[1] + 6) =
       (3 < const_4[1]._6_1_) * '\x03' | (3 >= const_4[1]._6_1_) * const_4[1]._6_1_;
  *(byte *)((long)level[1] + 7) =
       (3 < const_4[1]._7_1_) * '\x03' | (3 >= const_4[1]._7_1_) * const_4[1]._7_1_;
  *(byte *)(level[1] + 1) =
       (3 < (byte)const_3[0]) * '\x03' | (3 >= (byte)const_3[0]) * (byte)const_3[0];
  *(byte *)((long)level[1] + 9) =
       (3 < const_3[0]._1_1_) * '\x03' | (3 >= const_3[0]._1_1_) * const_3[0]._1_1_;
  *(byte *)((long)level[1] + 10) =
       (3 < const_3[0]._2_1_) * '\x03' | (3 >= const_3[0]._2_1_) * const_3[0]._2_1_;
  *(byte *)((long)level[1] + 0xb) =
       (3 < const_3[0]._3_1_) * '\x03' | (3 >= const_3[0]._3_1_) * const_3[0]._3_1_;
  *(byte *)((long)level[1] + 0xc) =
       (3 < const_3[0]._4_1_) * '\x03' | (3 >= const_3[0]._4_1_) * const_3[0]._4_1_;
  *(byte *)((long)level[1] + 0xd) =
       (3 < const_3[0]._5_1_) * '\x03' | (3 >= const_3[0]._5_1_) * const_3[0]._5_1_;
  *(byte *)((long)level[1] + 0xe) =
       (3 < const_3[0]._6_1_) * '\x03' | (3 >= const_3[0]._6_1_) * const_3[0]._6_1_;
  *(byte *)((long)level[1] + 0xf) =
       (3 < const_3[0]._7_1_) * '\x03' | (3 >= const_3[0]._7_1_) * const_3[0]._7_1_;
  lVar1 = level[2][0];
  lVar2 = level[2][1];
  bStack_88 = (byte)lVar1;
  bStack_87 = (byte)((ulong)lVar1 >> 8);
  bStack_86 = (byte)((ulong)lVar1 >> 0x10);
  bStack_85 = (byte)((ulong)lVar1 >> 0x18);
  bStack_84 = (byte)((ulong)lVar1 >> 0x20);
  bStack_83 = (byte)((ulong)lVar1 >> 0x28);
  bStack_82 = (byte)((ulong)lVar1 >> 0x30);
  bStack_81 = (byte)((ulong)lVar1 >> 0x38);
  count[0]._0_1_ = (byte)lVar2;
  count[0]._1_1_ = (byte)((ulong)lVar2 >> 8);
  count[0]._2_1_ = (byte)((ulong)lVar2 >> 0x10);
  count[0]._3_1_ = (byte)((ulong)lVar2 >> 0x18);
  count[0]._4_1_ = (byte)((ulong)lVar2 >> 0x20);
  count[0]._5_1_ = (byte)((ulong)lVar2 >> 0x28);
  count[0]._6_1_ = (byte)((ulong)lVar2 >> 0x30);
  count[0]._7_1_ = (byte)((ulong)lVar2 >> 0x38);
  *(byte *)level[2] = (3 < bStack_88) * '\x03' | (3 >= bStack_88) * bStack_88;
  *(byte *)((long)level[2] + 1) = (3 < bStack_87) * '\x03' | (3 >= bStack_87) * bStack_87;
  *(byte *)((long)level[2] + 2) = (3 < bStack_86) * '\x03' | (3 >= bStack_86) * bStack_86;
  *(byte *)((long)level[2] + 3) = (3 < bStack_85) * '\x03' | (3 >= bStack_85) * bStack_85;
  *(byte *)((long)level[2] + 4) = (3 < bStack_84) * '\x03' | (3 >= bStack_84) * bStack_84;
  *(byte *)((long)level[2] + 5) = (3 < bStack_83) * '\x03' | (3 >= bStack_83) * bStack_83;
  *(byte *)((long)level[2] + 6) = (3 < bStack_82) * '\x03' | (3 >= bStack_82) * bStack_82;
  *(byte *)((long)level[2] + 7) = (3 < bStack_81) * '\x03' | (3 >= bStack_81) * bStack_81;
  *(byte *)(level[2] + 1) = (3 < (byte)count[0]) * '\x03' | (3 >= (byte)count[0]) * (byte)count[0];
  *(byte *)((long)level[2] + 9) =
       (3 < count[0]._1_1_) * '\x03' | (3 >= count[0]._1_1_) * count[0]._1_1_;
  *(byte *)((long)level[2] + 10) =
       (3 < count[0]._2_1_) * '\x03' | (3 >= count[0]._2_1_) * count[0]._2_1_;
  *(byte *)((long)level[2] + 0xb) =
       (3 < count[0]._3_1_) * '\x03' | (3 >= count[0]._3_1_) * count[0]._3_1_;
  *(byte *)((long)level[2] + 0xc) =
       (3 < count[0]._4_1_) * '\x03' | (3 >= count[0]._4_1_) * count[0]._4_1_;
  *(byte *)((long)level[2] + 0xd) =
       (3 < count[0]._5_1_) * '\x03' | (3 >= count[0]._5_1_) * count[0]._5_1_;
  *(byte *)((long)level[2] + 0xe) =
       (3 < count[0]._6_1_) * '\x03' | (3 >= count[0]._6_1_) * count[0]._6_1_;
  *(byte *)((long)level[2] + 0xf) =
       (3 < count[0]._7_1_) * '\x03' | (3 >= count[0]._7_1_) * count[0]._7_1_;
  lVar1 = level[3][0];
  lVar2 = level[3][1];
  local_a8 = (byte)lVar1;
  bStack_a7 = (byte)((ulong)lVar1 >> 8);
  bStack_a6 = (byte)((ulong)lVar1 >> 0x10);
  bStack_a5 = (byte)((ulong)lVar1 >> 0x18);
  bStack_a4 = (byte)((ulong)lVar1 >> 0x20);
  bStack_a3 = (byte)((ulong)lVar1 >> 0x28);
  bStack_a2 = (byte)((ulong)lVar1 >> 0x30);
  bStack_a1 = (byte)((ulong)lVar1 >> 0x38);
  bStack_a0 = (byte)lVar2;
  bStack_9f = (byte)((ulong)lVar2 >> 8);
  bStack_9e = (byte)((ulong)lVar2 >> 0x10);
  bStack_9d = (byte)((ulong)lVar2 >> 0x18);
  bStack_9c = (byte)((ulong)lVar2 >> 0x20);
  bStack_9b = (byte)((ulong)lVar2 >> 0x28);
  bStack_9a = (byte)((ulong)lVar2 >> 0x30);
  bStack_99 = (byte)((ulong)lVar2 >> 0x38);
  *(byte *)level[3] = (3 < local_a8) * '\x03' | (3 >= local_a8) * local_a8;
  *(byte *)((long)level[3] + 1) = (3 < bStack_a7) * '\x03' | (3 >= bStack_a7) * bStack_a7;
  *(byte *)((long)level[3] + 2) = (3 < bStack_a6) * '\x03' | (3 >= bStack_a6) * bStack_a6;
  *(byte *)((long)level[3] + 3) = (3 < bStack_a5) * '\x03' | (3 >= bStack_a5) * bStack_a5;
  *(byte *)((long)level[3] + 4) = (3 < bStack_a4) * '\x03' | (3 >= bStack_a4) * bStack_a4;
  *(byte *)((long)level[3] + 5) = (3 < bStack_a3) * '\x03' | (3 >= bStack_a3) * bStack_a3;
  *(byte *)((long)level[3] + 6) = (3 < bStack_a2) * '\x03' | (3 >= bStack_a2) * bStack_a2;
  *(byte *)((long)level[3] + 7) = (3 < bStack_a1) * '\x03' | (3 >= bStack_a1) * bStack_a1;
  *(byte *)(level[3] + 1) = (3 < bStack_a0) * '\x03' | (3 >= bStack_a0) * bStack_a0;
  *(byte *)((long)level[3] + 9) = (3 < bStack_9f) * '\x03' | (3 >= bStack_9f) * bStack_9f;
  *(byte *)((long)level[3] + 10) = (3 < bStack_9e) * '\x03' | (3 >= bStack_9e) * bStack_9e;
  *(byte *)((long)level[3] + 0xb) = (3 < bStack_9d) * '\x03' | (3 >= bStack_9d) * bStack_9d;
  *(byte *)((long)level[3] + 0xc) = (3 < bStack_9c) * '\x03' | (3 >= bStack_9c) * bStack_9c;
  *(byte *)((long)level[3] + 0xd) = (3 < bStack_9b) * '\x03' | (3 >= bStack_9b) * bStack_9b;
  *(byte *)((long)level[3] + 0xe) = (3 < bStack_9a) * '\x03' | (3 >= bStack_9a) * bStack_9a;
  *(byte *)((long)level[3] + 0xf) = (3 < bStack_99) * '\x03' | (3 >= bStack_99) * bStack_99;
  lVar1 = level[4][0];
  lVar2 = level[4][1];
  local_c8 = (byte)lVar1;
  bStack_c7 = (byte)((ulong)lVar1 >> 8);
  bStack_c6 = (byte)((ulong)lVar1 >> 0x10);
  bStack_c5 = (byte)((ulong)lVar1 >> 0x18);
  bStack_c4 = (byte)((ulong)lVar1 >> 0x20);
  bStack_c3 = (byte)((ulong)lVar1 >> 0x28);
  bStack_c2 = (byte)((ulong)lVar1 >> 0x30);
  bStack_c1 = (byte)((ulong)lVar1 >> 0x38);
  bStack_c0 = (byte)lVar2;
  bStack_bf = (byte)((ulong)lVar2 >> 8);
  bStack_be = (byte)((ulong)lVar2 >> 0x10);
  bStack_bd = (byte)((ulong)lVar2 >> 0x18);
  bStack_bc = (byte)((ulong)lVar2 >> 0x20);
  bStack_bb = (byte)((ulong)lVar2 >> 0x28);
  bStack_ba = (byte)((ulong)lVar2 >> 0x30);
  bStack_b9 = (byte)((ulong)lVar2 >> 0x38);
  *(byte *)level[4] = (3 < local_c8) * '\x03' | (3 >= local_c8) * local_c8;
  *(byte *)((long)level[4] + 1) = (3 < bStack_c7) * '\x03' | (3 >= bStack_c7) * bStack_c7;
  *(byte *)((long)level[4] + 2) = (3 < bStack_c6) * '\x03' | (3 >= bStack_c6) * bStack_c6;
  *(byte *)((long)level[4] + 3) = (3 < bStack_c5) * '\x03' | (3 >= bStack_c5) * bStack_c5;
  *(byte *)((long)level[4] + 4) = (3 < bStack_c4) * '\x03' | (3 >= bStack_c4) * bStack_c4;
  *(byte *)((long)level[4] + 5) = (3 < bStack_c3) * '\x03' | (3 >= bStack_c3) * bStack_c3;
  *(byte *)((long)level[4] + 6) = (3 < bStack_c2) * '\x03' | (3 >= bStack_c2) * bStack_c2;
  *(byte *)((long)level[4] + 7) = (3 < bStack_c1) * '\x03' | (3 >= bStack_c1) * bStack_c1;
  *(byte *)(level[4] + 1) = (3 < bStack_c0) * '\x03' | (3 >= bStack_c0) * bStack_c0;
  *(byte *)((long)level[4] + 9) = (3 < bStack_bf) * '\x03' | (3 >= bStack_bf) * bStack_bf;
  *(byte *)((long)level[4] + 10) = (3 < bStack_be) * '\x03' | (3 >= bStack_be) * bStack_be;
  *(byte *)((long)level[4] + 0xb) = (3 < bStack_bd) * '\x03' | (3 >= bStack_bd) * bStack_bd;
  *(byte *)((long)level[4] + 0xc) = (3 < bStack_bc) * '\x03' | (3 >= bStack_bc) * bStack_bc;
  *(byte *)((long)level[4] + 0xd) = (3 < bStack_bb) * '\x03' | (3 >= bStack_bb) * bStack_bb;
  *(byte *)((long)level[4] + 0xe) = (3 < bStack_ba) * '\x03' | (3 >= bStack_ba) * bStack_ba;
  *(byte *)((long)level[4] + 0xf) = (3 < bStack_b9) * '\x03' | (3 >= bStack_b9) * bStack_b9;
  lVar1 = level[1][0];
  lVar2 = level[1][1];
  local_158 = (char)lVar1;
  cStack_157 = (char)((ulong)lVar1 >> 8);
  cStack_156 = (char)((ulong)lVar1 >> 0x10);
  cStack_155 = (char)((ulong)lVar1 >> 0x18);
  cStack_154 = (char)((ulong)lVar1 >> 0x20);
  cStack_153 = (char)((ulong)lVar1 >> 0x28);
  cStack_152 = (char)((ulong)lVar1 >> 0x30);
  cStack_151 = (char)((ulong)lVar1 >> 0x38);
  cStack_150 = (char)lVar2;
  cStack_14f = (char)((ulong)lVar2 >> 8);
  cStack_14e = (char)((ulong)lVar2 >> 0x10);
  cStack_14d = (char)((ulong)lVar2 >> 0x18);
  cStack_14c = (char)((ulong)lVar2 >> 0x20);
  cStack_14b = (char)((ulong)lVar2 >> 0x28);
  cStack_14a = (char)((ulong)lVar2 >> 0x30);
  cStack_149 = (char)((ulong)lVar2 >> 0x38);
  lVar1 = level[2][0];
  lVar2 = level[2][1];
  local_178 = (char)lVar1;
  cStack_177 = (char)((ulong)lVar1 >> 8);
  cStack_176 = (char)((ulong)lVar1 >> 0x10);
  cStack_175 = (char)((ulong)lVar1 >> 0x18);
  cStack_174 = (char)((ulong)lVar1 >> 0x20);
  cStack_173 = (char)((ulong)lVar1 >> 0x28);
  cStack_172 = (char)((ulong)lVar1 >> 0x30);
  cStack_171 = (char)((ulong)lVar1 >> 0x38);
  cStack_170 = (char)lVar2;
  cStack_16f = (char)((ulong)lVar2 >> 8);
  cStack_16e = (char)((ulong)lVar2 >> 0x10);
  cStack_16d = (char)((ulong)lVar2 >> 0x18);
  cStack_16c = (char)((ulong)lVar2 >> 0x20);
  cStack_16b = (char)((ulong)lVar2 >> 0x28);
  cStack_16a = (char)((ulong)lVar2 >> 0x30);
  cStack_169 = (char)((ulong)lVar2 >> 0x38);
  lVar1 = level[3][0];
  lVar2 = level[3][1];
  local_198 = (char)lVar1;
  cStack_197 = (char)((ulong)lVar1 >> 8);
  cStack_196 = (char)((ulong)lVar1 >> 0x10);
  cStack_195 = (char)((ulong)lVar1 >> 0x18);
  cStack_194 = (char)((ulong)lVar1 >> 0x20);
  cStack_193 = (char)((ulong)lVar1 >> 0x28);
  cStack_192 = (char)((ulong)lVar1 >> 0x30);
  cStack_191 = (char)((ulong)lVar1 >> 0x38);
  cStack_190 = (char)lVar2;
  cStack_18f = (char)((ulong)lVar2 >> 8);
  cStack_18e = (char)((ulong)lVar2 >> 0x10);
  cStack_18d = (char)((ulong)lVar2 >> 0x18);
  cStack_18c = (char)((ulong)lVar2 >> 0x20);
  cStack_18b = (char)((ulong)lVar2 >> 0x28);
  cStack_18a = (char)((ulong)lVar2 >> 0x30);
  cStack_189 = (char)((ulong)lVar2 >> 0x38);
  lVar1 = level[4][0];
  lVar2 = level[4][1];
  local_1b8 = (char)lVar1;
  cStack_1b7 = (char)((ulong)lVar1 >> 8);
  cStack_1b6 = (char)((ulong)lVar1 >> 0x10);
  cStack_1b5 = (char)((ulong)lVar1 >> 0x18);
  cStack_1b4 = (char)((ulong)lVar1 >> 0x20);
  cStack_1b3 = (char)((ulong)lVar1 >> 0x28);
  cStack_1b2 = (char)((ulong)lVar1 >> 0x30);
  cStack_1b1 = (char)((ulong)lVar1 >> 0x38);
  cStack_1b0 = (char)lVar2;
  cStack_1af = (char)((ulong)lVar2 >> 8);
  cStack_1ae = (char)((ulong)lVar2 >> 0x10);
  cStack_1ad = (char)((ulong)lVar2 >> 0x18);
  cStack_1ac = (char)((ulong)lVar2 >> 0x20);
  cStack_1ab = (char)((ulong)lVar2 >> 0x28);
  cStack_1aa = (char)((ulong)lVar2 >> 0x30);
  cStack_1a9 = (char)((ulong)lVar2 >> 0x38);
  pavgb(((3 < local_48) * '\x03' | (3 >= local_48) * local_48) + local_158 + local_178 + local_198 +
        local_1b8,0);
  pavgb(((3 < bStack_47) * '\x03' | (3 >= bStack_47) * bStack_47) + cStack_157 + cStack_177 +
        cStack_197 + cStack_1b7,0);
  pavgb(((3 < bStack_46) * '\x03' | (3 >= bStack_46) * bStack_46) + cStack_156 + cStack_176 +
        cStack_196 + cStack_1b6,0);
  pavgb(((3 < bStack_45) * '\x03' | (3 >= bStack_45) * bStack_45) + cStack_155 + cStack_175 +
        cStack_195 + cStack_1b5,0);
  pavgb(((3 < bStack_44) * '\x03' | (3 >= bStack_44) * bStack_44) + cStack_154 + cStack_174 +
        cStack_194 + cStack_1b4,0);
  pavgb(((3 < bStack_43) * '\x03' | (3 >= bStack_43) * bStack_43) + cStack_153 + cStack_173 +
        cStack_193 + cStack_1b3,0);
  pavgb(((3 < bStack_42) * '\x03' | (3 >= bStack_42) * bStack_42) + cStack_152 + cStack_172 +
        cStack_192 + cStack_1b2,0);
  pavgb(((3 < bStack_41) * '\x03' | (3 >= bStack_41) * bStack_41) + cStack_151 + cStack_171 +
        cStack_191 + cStack_1b1,0);
  pavgb(((3 < bStack_40) * '\x03' | (3 >= bStack_40) * bStack_40) + cStack_150 + cStack_170 +
        cStack_190 + cStack_1b0,0);
  pavgb(((3 < bStack_3f) * '\x03' | (3 >= bStack_3f) * bStack_3f) + cStack_14f + cStack_16f +
        cStack_18f + cStack_1af,0);
  pavgb(((3 < bStack_3e) * '\x03' | (3 >= bStack_3e) * bStack_3e) + cStack_14e + cStack_16e +
        cStack_18e + cStack_1ae,0);
  pavgb(((3 < bStack_3d) * '\x03' | (3 >= bStack_3d) * bStack_3d) + cStack_14d + cStack_16d +
        cStack_18d + cStack_1ad,0);
  pavgb(((3 < bStack_3c) * '\x03' | (3 >= bStack_3c) * bStack_3c) + cStack_14c + cStack_16c +
        cStack_18c + cStack_1ac,0);
  pavgb(((3 < bStack_3b) * '\x03' | (3 >= bStack_3b) * bStack_3b) + cStack_14b + cStack_16b +
        cStack_18b + cStack_1ab,0);
  pavgb(((3 < bStack_3a) * '\x03' | (3 >= bStack_3a) * bStack_3a) + cStack_14a + cStack_16a +
        cStack_18a + cStack_1aa,0);
  pavgb(((3 < bStack_39) * '\x03' | (3 >= bStack_39) * bStack_39) + cStack_149 + cStack_169 +
        cStack_189 + cStack_1a9,0);
  alVar3[1] = in_RDX;
  alVar3[0] = (longlong)level;
  return alVar3;
}

Assistant:

static inline __m128i get_coeff_contexts_kernel_sse2(__m128i *const level) {
  const __m128i const_3 = _mm_set1_epi8(3);
  const __m128i const_4 = _mm_set1_epi8(4);
  __m128i count;

  count = _mm_min_epu8(level[0], const_3);
  level[1] = _mm_min_epu8(level[1], const_3);
  level[2] = _mm_min_epu8(level[2], const_3);
  level[3] = _mm_min_epu8(level[3], const_3);
  level[4] = _mm_min_epu8(level[4], const_3);
  count = _mm_add_epi8(count, level[1]);
  count = _mm_add_epi8(count, level[2]);
  count = _mm_add_epi8(count, level[3]);
  count = _mm_add_epi8(count, level[4]);
  count = _mm_avg_epu8(count, _mm_setzero_si128());
  count = _mm_min_epu8(count, const_4);
  return count;
}